

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_quantization.cc
# Opt level: O3

bool __thiscall
sptk::VectorQuantization::Run
          (VectorQuantization *this,vector<double,_std::allocator<double>_> *input_vector,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *codebook_vectors,int *codebook_index)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double distance;
  double local_38;
  
  if (this->is_valid_ == true) {
    bVar1 = false;
    if (((codebook_index != (int *)0x0) &&
        (uVar3 = (int)((long)(codebook_vectors->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(codebook_vectors->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555,
        bVar1 = false, uVar3 != 0)) &&
       ((long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == (long)this->num_order_ + 1)) {
      if ((int)uVar3 < 1) {
        iVar4 = 0;
      }
      else {
        lVar2 = 0;
        uVar6 = 0;
        uVar5 = 0;
        dVar7 = 1.79769313486232e+308;
        do {
          bVar1 = DistanceCalculation::Run
                            (&this->distance_calculation_,input_vector,
                             (vector<double,_std::allocator<double>_> *)
                             ((long)&(((codebook_vectors->
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data + lVar2),&local_38);
          if (!bVar1) goto LAB_0011163c;
          if (local_38 < dVar7) {
            uVar5 = uVar6 & 0xffffffff;
          }
          iVar4 = (int)uVar5;
          dVar8 = local_38;
          if (dVar7 <= local_38) {
            dVar8 = dVar7;
          }
          uVar6 = uVar6 + 1;
          lVar2 = lVar2 + 0x18;
          dVar7 = dVar8;
        } while ((uVar3 & 0x7fffffff) != uVar6);
      }
      *codebook_index = iVar4;
      bVar1 = true;
    }
  }
  else {
LAB_0011163c:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool VectorQuantization::Run(
    const std::vector<double>& input_vector,
    const std::vector<std::vector<double> >& codebook_vectors,
    int* codebook_index) const {
  // Check inputs.
  const int codebook_size(static_cast<int>(codebook_vectors.size()));
  if (!is_valid_ ||
      input_vector.size() != static_cast<std::size_t>(num_order_ + 1) ||
      0 == codebook_size || NULL == codebook_index) {
    return false;
  }

  int index(0);
  double min_distance(sptk::kMax);

  for (int i(0); i < codebook_size; ++i) {
    double distance;
    if (!distance_calculation_.Run(input_vector, codebook_vectors[i],
                                   &distance)) {
      return false;
    }
    if (distance < min_distance) {
      index = i;
      min_distance = distance;
    }
  }

  *codebook_index = index;

  return true;
}